

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O0

pair<int,_int> mxx::right_shift<std::pair<int,int>>(pair<int,_int> *t,comm *comm)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  MPI_Datatype poVar4;
  MPI_Comm poVar5;
  undefined1 local_58 [8];
  MPI_Request recv_req;
  undefined4 local_3c;
  undefined1 local_38 [4];
  int tag;
  datatype dt;
  comm *comm_local;
  pair<int,_int> *t_local;
  pair<int,_int> left_value;
  
  dt._16_8_ = comm;
  get_datatype<std::pair<int,int>>();
  local_3c = 0xd;
  std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&t_local);
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    poVar4 = datatype::type((datatype *)local_38);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = local_3c;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Irecv(&t_local,1,poVar4,iVar2 + -1,uVar1,poVar5,local_58);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  iVar3 = mxx::comm::size((comm *)dt._16_8_);
  if (iVar2 < iVar3 + -1) {
    poVar4 = datatype::type((datatype *)local_38);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = local_3c;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Send(t,1,poVar4,iVar2 + 1,uVar1,poVar5);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    MPI_Wait(local_58,0);
  }
  datatype::~datatype((datatype *)local_38);
  return (pair<int,_int>)t_local;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}